

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::clear(BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  bool __i;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> pushLock;
  lock_guard<std::mutex> pullLock;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::lock_guard<std::mutex>::lock_guard
            (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x53d730);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x53d73e);
  while( true ) {
    __i = CLI::std::
          queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
          ::empty((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                   *)0x53d74f);
    if (((__i ^ 0xffU) & 1) == 0) break;
    CLI::std::
    queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
    ::pop((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
           *)0x53d772);
  }
  std::atomic<bool>::operator=((atomic<bool> *)in_RDI,__i);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x53d7c0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x53d7ca);
  return;
}

Assistant:

void clear()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            pullElements.clear();
            pushElements.clear();
            while (!priorityQueue.empty()) {
                priorityQueue.pop();
            }
            queueEmptyFlag = true;
        }